

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O2

bool Map_InsertObject(PCASC_MAP pMap,void *pvNewObject,void *pvKey)

{
  ulong uVar1;
  bool bVar2;
  DWORD DVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (pMap == (PCASC_MAP)0x0) {
    return false;
  }
  uVar1 = pMap->TableSize;
  uVar5 = pMap->ItemCount + 1;
  if (uVar5 < uVar1) {
    DVar3 = CalcHashIndex_Key(pMap,pvKey);
    uVar4 = (ulong)DVar3;
    while( true ) {
      if (pMap->HashTable[uVar4 & 0xffffffff] == (void *)0x0) break;
      bVar2 = CompareObject_Key(pMap,pMap->HashTable[uVar4 & 0xffffffff],pvKey);
      if (bVar2) goto LAB_00110927;
      uVar4 = (ulong)((int)uVar4 + 1) % uVar1;
    }
    pMap->HashTable[uVar4 & 0xffffffff] = pvNewObject;
    pMap->ItemCount = uVar5;
    bVar2 = true;
  }
  else {
LAB_00110927:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Map_InsertObject(PCASC_MAP pMap, void * pvNewObject, void * pvKey)
{
    void * pvExistingObject;
    DWORD dwHashIndex;

    // Verify pointer to the map
    if(pMap != NULL)
    {
        // Limit check
        if((pMap->ItemCount + 1) >= pMap->TableSize)
            return false;

        // Construct the hash index
        dwHashIndex = CalcHashIndex_Key(pMap, pvKey);
        while(pMap->HashTable[dwHashIndex] != NULL)
        {
            // Get the pointer at that position
            pvExistingObject = pMap->HashTable[dwHashIndex];

            // Check if hash being inserted conflicts with an existing hash
            if(CompareObject_Key(pMap, pvExistingObject, pvKey))
                return false;

            // Move to the next entry
            dwHashIndex = (dwHashIndex + 1) % pMap->TableSize;
        }

        // Insert at that position
        pMap->HashTable[dwHashIndex] = pvNewObject;
        pMap->ItemCount++;
        return true;
    }

    // Failed
    return false;
}